

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O2

void __thiscall
FastPForLib::Simple16<false>::fakeencodeArray
          (Simple16<false> *this,uint32_t *in,size_t length,size_t *nvalue)

{
  bool bVar1;
  size_t sVar2;
  ulong uStack_40;
  
  sVar2 = 0;
  do {
    if (length == 0) {
      *nvalue = sVar2;
      return;
    }
    bVar1 = tryme<28u,1u>(in,length);
    if (bVar1) {
      bVar1 = length < 0x1c;
      uStack_40 = 0x1c;
LAB_0011e0bf:
      if (bVar1) {
        uStack_40 = length;
      }
    }
    else {
      bVar1 = tryme<7u,2u,14u,1u>(in,length);
      if (((bVar1) || (bVar1 = tryme<7u,1u,7u,2u,7u,1u>(in,length), bVar1)) ||
         (bVar1 = tryme<14u,1u,7u,2u>(in,length), bVar1)) {
        bVar1 = length < 0x15;
        uStack_40 = 0x15;
        goto LAB_0011e0bf;
      }
      bVar1 = tryme<14u,2u>(in,length);
      if (bVar1) {
        bVar1 = length < 0xe;
        uStack_40 = 0xe;
        goto LAB_0011e0bf;
      }
      bVar1 = tryme<1u,4u,8u,3u>(in,length);
      if (bVar1) {
        bVar1 = length < 9;
        uStack_40 = 9;
        goto LAB_0011e0bf;
      }
      bVar1 = tryme<1u,3u,4u,4u,3u,3u>(in,length);
      if (bVar1) {
        bVar1 = length < 8;
        uStack_40 = 8;
        goto LAB_0011e0bf;
      }
      bVar1 = tryme<7u,4u>(in,length);
      if (bVar1) {
        bVar1 = length < 7;
        uStack_40 = 7;
        goto LAB_0011e0bf;
      }
      bVar1 = tryme<4u,5u,2u,4u>(in,length);
      if ((bVar1) || (bVar1 = tryme<2u,4u,4u,5u>(in,length), bVar1)) {
        bVar1 = length < 6;
        uStack_40 = 6;
        goto LAB_0011e0bf;
      }
      bVar1 = tryme<3u,6u,2u,5u>(in,length);
      if ((bVar1) || (bVar1 = tryme<2u,5u,3u,6u>(in,length), bVar1)) {
        bVar1 = length < 5;
        uStack_40 = 5;
        goto LAB_0011e0bf;
      }
      bVar1 = tryme<4u,7u>(in,length);
      if (bVar1) {
        bVar1 = length < 4;
        uStack_40 = 4;
        goto LAB_0011e0bf;
      }
      bVar1 = tryme<1u,10u,2u,9u>(in,length);
      if (bVar1) {
        bVar1 = length < 3;
        uStack_40 = 3;
        goto LAB_0011e0bf;
      }
      bVar1 = tryme<2u,14u>(in,length);
      uStack_40 = 1;
      if (bVar1) {
        uStack_40 = (ulong)(length != 1) + 1;
      }
    }
    in = in + uStack_40;
    length = length - uStack_40;
    sVar2 = sVar2 + 1;
  } while( true );
}

Assistant:

void Simple16<MarkLength>::fakeencodeArray(const uint32_t *in,
                                           const size_t length,
                                           size_t &nvalue) {
  uint32_t NumberOfValuesCoded = 0;
  size_t writtenout = 0;
  size_t ValuesRemaining(length);
  while (ValuesRemaining > 0) {
    if (tryme<28, 1>(in, ValuesRemaining)) {
      NumberOfValuesCoded =
          (ValuesRemaining < 28) ? static_cast<uint32_t>(ValuesRemaining) : 28;
    } else if (tryme<7, 2, 14, 1>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 7 + 14)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 7 + 14;
    } else if (tryme<7, 1, 7, 2, 7, 1>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 7 * 3)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 7 * 3;
    } else if (tryme<14, 1, 7, 2>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 14 + 7)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 14 + 7;
    } else if (tryme<14, 2>(in, ValuesRemaining)) {
      NumberOfValuesCoded =
          (ValuesRemaining < 14) ? static_cast<uint32_t>(ValuesRemaining) : 14;
    } else if (tryme<1, 4, 8, 3>(in, ValuesRemaining)) {
      NumberOfValuesCoded =
          (ValuesRemaining < 9) ? static_cast<uint32_t>(ValuesRemaining) : 9;
    } else if (tryme<1, 3, 4, 4, 3, 3>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 1 + 4 + 3)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 1 + 4 + 3;
    } else if (tryme<7, 4>(in, ValuesRemaining)) {
      NumberOfValuesCoded =
          (ValuesRemaining < 7) ? static_cast<uint32_t>(ValuesRemaining) : 7;
    } else if (tryme<4, 5, 2, 4>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 4 + 2)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 4 + 2;
    } else if (tryme<2, 4, 4, 5>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 2 + 4)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 2 + 4;
    } else if (tryme<3, 6, 2, 5>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 3 + 2)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 3 + 2;
    } else if (tryme<2, 5, 3, 6>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 2 + 3)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 2 + 3;
    } else if (tryme<4, 7>(in, ValuesRemaining)) {
      NumberOfValuesCoded =
          (ValuesRemaining < 4) ? static_cast<uint32_t>(ValuesRemaining) : 4;
    } else if (tryme<1, 10, 2, 9>(in, ValuesRemaining)) {
      NumberOfValuesCoded =
          (ValuesRemaining < 3) ? static_cast<uint32_t>(ValuesRemaining) : 3;
    } else if (tryme<2, 14>(in, ValuesRemaining)) {
      NumberOfValuesCoded =
          (ValuesRemaining < 2) ? static_cast<uint32_t>(ValuesRemaining) : 2;
    } else {
      NumberOfValuesCoded = 1;
    }
    in += NumberOfValuesCoded;
    ValuesRemaining -= NumberOfValuesCoded;
    ++writtenout;
  }
  nvalue = writtenout;
}